

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O0

void JitFFI::SysV64::CreateCaller
               (JitFuncCreater *jfc,ArgumentInfo *argumentinfo,void *func,ArgDataList *adlist)

{
  size_type sVar1;
  ArgTypeInfo *ati;
  RetData *retdata;
  undefined1 local_80 [8];
  JitFuncCallerCreater jfcc;
  ArgumentList list;
  ArgDataList *adlist_local;
  void *func_local;
  ArgumentInfo *argumentinfo_local;
  JitFuncCreater *jfc_local;
  
  sVar1 = std::__cxx11::list<const_void_*,_std::allocator<const_void_*>_>::size(adlist);
  if (sVar1 < 0xffffffff) {
    ati = get_argtypeinfo(argumentinfo);
    create_argumentlist((ArgumentList *)&jfcc.addarg_double_count,ati,adlist);
    JitFuncCallerCreater::JitFuncCallerCreater((JitFuncCallerCreater *)local_80,jfc);
    create_function_caller_head((JitFuncCallerCreater *)local_80);
    OpCode_x64::mov(jfc,rbx,rdi);
    create_argument((JitFuncCallerCreater *)local_80,(ArgumentList *)&jfcc.addarg_double_count);
    JitFuncCallerCreater::call((JitFuncCallerCreater *)local_80,func);
    retdata = ArgumentList::get_retdata((ArgumentList *)&jfcc.addarg_double_count);
    create_return((JitFuncCallerCreater *)local_80,retdata);
    create_function_caller_foot((JitFuncCallerCreater *)local_80);
    ArgumentList::~ArgumentList((ArgumentList *)&jfcc.addarg_double_count);
    return;
  }
  __assert_fail("adlist.size() < UINT32_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                ,0x3f6,
                "void JitFFI::SysV64::CreateCaller(JitFuncCreater &, const ArgumentInfo &, void *, const ArgDataList &)"
               );
}

Assistant:

void CreateCaller(JitFuncCreater &jfc, const ArgumentInfo &argumentinfo, void *func, const ArgDataList &adlist)
		{
			assert(adlist.size() < UINT32_MAX);

			ArgumentList list = create_argumentlist(get_argtypeinfo(argumentinfo), adlist);

			//printf("<");
			//for (auto &e : list.list) {
			//	printf("(%d 0x%llX)\n", e.type, e.data);
			//}
			//printf(">\n");

			JitFuncCallerCreater jfcc(jfc);
			create_function_caller_head(jfcc);

			mov(jfc, rbx, rdi);
			create_argument(jfcc, list);

			jfcc.call(func);

			create_return(jfcc, list.get_retdata());

			create_function_caller_foot(jfcc);
		}